

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O3

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pointer pMVar7;
  Mat *this_00;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  undefined4 extraout_EAX;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float local_11c;
  float local_118;
  float fStack_114;
  long local_100;
  void *local_f8;
  float fStack_c4;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar29 = -1;
  if (pMVar7->c == this->pooled_width * this->output_dim * this->pooled_height) {
    uVar4 = pMVar7->w;
    uVar18 = (ulong)(int)uVar4;
    uVar5 = pMVar7->h;
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,this->pooled_width,this->pooled_height,this->output_dim,pMVar7->elemsize,
                opt->blob_allocator);
    pvVar8 = this_00->data;
    iVar29 = -100;
    if ((pvVar8 != (void *)0x0) && (sVar9 = this_00->cstep, (long)this_00->c * sVar9 != 0)) {
      uVar2 = *pMVar7[1].data;
      uVar3 = *(undefined8 *)((long)pMVar7[1].data + 8);
      fVar31 = roundf((float)uVar2);
      fStack_c4 = (float)((ulong)uVar2 >> 0x20);
      fVar32 = roundf(fStack_c4);
      fVar35 = this->spatial_scale;
      fVar31 = fVar31 * fVar35;
      fVar32 = fVar32 * fVar35;
      local_118 = (float)uVar3;
      fStack_114 = (float)((ulong)uVar3 >> 0x20);
      fVar33 = roundf(local_118 + 1.0);
      fVar34 = roundf(fStack_114 + 1.0);
      fVar33 = fVar33 * fVar35 - fVar31;
      fVar35 = fVar34 * fVar35 - fVar32;
      iVar29 = -(uint)(fVar33 < 0.1);
      iVar30 = -(uint)(fVar35 < 0.1);
      auVar12._4_4_ = iVar29;
      auVar12._0_4_ = iVar29;
      auVar12._8_4_ = iVar30;
      auVar12._12_4_ = iVar30;
      uVar15 = movmskpd(extraout_EAX,auVar12);
      local_11c = 0.1;
      local_118 = 0.1;
      if ((uVar15 & 1) == 0) {
        local_118 = fVar33;
      }
      if ((uVar15 & 2) == 0) {
        local_11c = fVar35;
      }
      iVar29 = this->output_dim;
      if (0 < (long)iVar29) {
        iVar30 = this->pooled_width;
        lVar19 = (long)iVar30;
        uVar15 = this->pooled_height;
        sVar10 = this_00->elemsize;
        local_100 = 0;
        do {
          if (0 < (int)uVar15) {
            local_f8 = (void *)(sVar9 * sVar10 * local_100 + (long)pvVar8);
            iVar6 = this->pooled_height;
            uVar27 = 0;
            do {
              if (0 < iVar30) {
                sVar11 = pMVar7->elemsize;
                fVar35 = floorf((float)(int)uVar27 * (local_11c / (float)(int)uVar15) + fVar32);
                fVar33 = ceilf((float)((int)uVar27 + 1) * (local_11c / (float)(int)uVar15) + fVar32)
                ;
                uVar21 = (uint)fVar33;
                uVar13 = (int)fVar35;
                if ((int)fVar35 < 1) {
                  uVar13 = 0;
                }
                uVar16 = uVar13;
                if ((int)uVar5 < (int)uVar13) {
                  uVar16 = uVar5;
                }
                if ((int)uVar21 < 1) {
                  uVar21 = 0;
                }
                if ((int)uVar5 < (int)uVar21) {
                  uVar21 = uVar5;
                }
                lVar26 = sVar11 * pMVar7->cstep;
                lVar20 = uVar18 * 4 * (ulong)uVar13 +
                         (uVar27 + (long)(iVar6 * (int)local_100)) * lVar19 * lVar26 +
                         (long)pMVar7->data;
                lVar28 = 0;
                do {
                  fVar35 = floorf((float)(int)lVar28 * (local_118 / (float)iVar30) + fVar31);
                  lVar1 = lVar28 + 1;
                  fVar33 = ceilf((float)(int)lVar1 * (local_118 / (float)iVar30) + fVar31);
                  uVar17 = (uint)fVar33;
                  uVar14 = (int)fVar35;
                  if ((int)fVar35 < 1) {
                    uVar14 = 0;
                  }
                  uVar22 = uVar14;
                  if ((int)uVar4 < (int)uVar14) {
                    uVar22 = uVar4;
                  }
                  if ((int)uVar17 < 1) {
                    uVar17 = 0;
                  }
                  if ((int)uVar4 < (int)uVar17) {
                    uVar17 = uVar4;
                  }
                  fVar35 = 0.0;
                  fVar33 = 0.0;
                  if ((int)uVar13 < (int)uVar21) {
                    uVar24 = (ulong)uVar14;
                    if ((long)uVar18 <= (long)(ulong)uVar14) {
                      uVar24 = uVar18;
                    }
                    lVar23 = uVar24 * 4 + lVar20;
                    uVar24 = (ulong)uVar13;
                    do {
                      if ((int)uVar14 < (int)uVar17) {
                        lVar25 = 0;
                        do {
                          fVar33 = fVar33 + *(float *)(lVar23 + lVar25 * 4);
                          lVar25 = lVar25 + 1;
                        } while (uVar17 - uVar22 != (int)lVar25);
                      }
                      uVar24 = uVar24 + 1;
                      lVar23 = lVar23 + uVar18 * 4;
                    } while ((uVar13 + uVar21) - uVar16 != (int)uVar24);
                  }
                  if ((int)uVar13 < (int)uVar21 && (int)uVar14 < (int)uVar17) {
                    fVar35 = fVar33 / (float)(int)((uVar17 - uVar22) * (uVar21 - uVar16));
                  }
                  *(float *)((long)local_f8 + lVar28 * 4) = fVar35;
                  lVar20 = lVar20 + lVar26;
                  lVar28 = lVar1;
                } while (lVar1 != lVar19);
              }
              uVar27 = uVar27 + 1;
              local_f8 = (void *)((long)local_f8 + lVar19 * 4);
            } while (uVar27 != uVar15);
          }
          local_100 = local_100 + 1;
        } while (local_100 != iVar29);
      }
      iVar29 = 0;
    }
  }
  return iVar29;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = static_cast<float>(round(roi_ptr[0]) * spatial_scale);
    float roi_y1 = static_cast<float>(round(roi_ptr[1]) * spatial_scale);
    float roi_x2 = static_cast<float>(round(roi_ptr[2] + 1.f) * spatial_scale);
    float roi_y2 = static_cast<float>(round(roi_ptr[3] + 1.f) * spatial_scale);

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = static_cast<int>(floor(roi_y1 + (float)(ph) * bin_size_h));
                int wstart = static_cast<int>(floor(roi_x1 + (float)(pw) * bin_size_w));
                int hend = static_cast<int>(ceil(roi_y1 + (float)(ph + 1) * bin_size_h));
                int wend = static_cast<int>(ceil(roi_x1 + (float)(pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}